

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O3

bool_t BufferToBase64(tchar_t *Out,size_t OutLen,uint8_t *Buffer,size_t BufferSize)

{
  byte bVar1;
  byte bVar2;
  
  if (4 < OutLen && 2 < BufferSize) {
    do {
      bVar2 = *Buffer;
      bVar1 = bVar2 >> 2;
      if (bVar2 < 0x68) {
        bVar1 = bVar1 + 0x41;
      }
      else if (bVar2 < 0xd0) {
        bVar1 = bVar1 + 0x47;
      }
      else if (bVar2 < 0xf8) {
        bVar1 = bVar1 - 4;
      }
      else {
        bVar1 = (bVar1 != 0x3e) << 2 | 0x2b;
      }
      *Out = bVar1;
      bVar2 = (*Buffer & 3) << 4 | Buffer[1] >> 4;
      if (bVar2 < 0x1a) {
        bVar2 = bVar2 + 0x41;
      }
      else if (bVar2 < 0x34) {
        bVar2 = bVar2 + 0x47;
      }
      else if (bVar2 < 0x3e) {
        bVar2 = bVar2 - 4;
      }
      else {
        bVar2 = (bVar2 != 0x3e) << 2 | 0x2b;
      }
      ((byte *)Out)[1] = bVar2;
      bVar2 = Buffer[2] >> 6 | Buffer[1] << 2 & 0x3f;
      if (bVar2 < 0x1a) {
        bVar2 = bVar2 + 0x41;
      }
      else if ((Buffer[1] << 2 & 0x3c) < 0x34) {
        bVar2 = bVar2 + 0x47;
      }
      else if (bVar2 < 0x3e) {
        bVar2 = bVar2 - 4;
      }
      else {
        bVar2 = (bVar2 != 0x3e) << 2 | 0x2b;
      }
      ((byte *)Out)[2] = bVar2;
      bVar2 = Buffer[2] & 0x3f;
      if (bVar2 < 0x1a) {
        bVar2 = bVar2 + 0x41;
      }
      else if (bVar2 < 0x34) {
        bVar2 = bVar2 + 0x47;
      }
      else if (bVar2 < 0x3e) {
        bVar2 = bVar2 - 4;
      }
      else {
        bVar2 = (bVar2 != 0x3e) << 2 | 0x2b;
      }
      ((byte *)Out)[3] = bVar2;
      BufferSize = BufferSize - 3;
      Buffer = Buffer + 3;
      OutLen = OutLen - 4;
      Out = (tchar_t *)((byte *)Out + 4);
    } while ((2 < BufferSize) && (4 < OutLen));
  }
  if (BufferSize == 0) goto LAB_001255f3;
  if (OutLen < 5) {
    return 0;
  }
  bVar2 = *Buffer;
  bVar1 = bVar2 >> 2;
  if (bVar2 < 0x68) {
    bVar1 = bVar1 + 0x41;
  }
  else if (bVar2 < 0xd0) {
    bVar1 = bVar1 + 0x47;
  }
  else if (bVar2 < 0xf8) {
    bVar1 = bVar1 - 4;
  }
  else {
    bVar1 = (bVar1 != 0x3e) << 2 | 0x2b;
  }
  *Out = bVar1;
  bVar2 = (*Buffer & 3) << 4;
  if (BufferSize == 1) {
    bVar1 = 0x47;
    if (bVar2 < 0x1a) {
      bVar1 = 0x41;
    }
    ((byte *)Out)[1] = bVar1 | bVar2;
    bVar2 = 0x3d;
LAB_001255e7:
    ((byte *)Out)[2] = bVar2;
    bVar2 = 0x3d;
  }
  else {
    bVar2 = bVar2 | Buffer[1] >> 4;
    if (bVar2 < 0x1a) {
      bVar2 = bVar2 + 0x41;
    }
    else if (bVar2 < 0x34) {
      bVar2 = bVar2 + 0x47;
    }
    else if (bVar2 < 0x3e) {
      bVar2 = bVar2 - 4;
    }
    else {
      bVar2 = (bVar2 != 0x3e) << 2 | 0x2b;
    }
    ((byte *)Out)[1] = bVar2;
    bVar2 = (Buffer[1] & 0xf) * '\x04';
    if (BufferSize == 2) {
      if (bVar2 < 0x1a) {
        bVar2 = bVar2 | 0x41;
      }
      else if (bVar2 < 0x34) {
        bVar2 = bVar2 + 0x47;
      }
      else {
        bVar2 = bVar2 - 4;
      }
      goto LAB_001255e7;
    }
    bVar1 = Buffer[2] >> 6 | bVar2;
    if (bVar1 < 0x1a) {
      bVar1 = bVar1 + 0x41;
    }
    else if (bVar2 < 0x34) {
      bVar1 = bVar1 + 0x47;
    }
    else if (bVar1 < 0x3e) {
      bVar1 = bVar1 - 4;
    }
    else {
      bVar1 = (bVar1 != 0x3e) << 2 | 0x2b;
    }
    ((byte *)Out)[2] = bVar1;
    bVar2 = Buffer[2] & 0x3f;
    if (bVar2 < 0x1a) {
      bVar2 = bVar2 + 0x41;
    }
    else if (bVar2 < 0x34) {
      bVar2 = bVar2 + 0x47;
    }
    else if (bVar2 < 0x3e) {
      bVar2 = bVar2 - 4;
    }
    else {
      bVar2 = (bVar2 != 0x3e) << 2 | 0x2b;
    }
  }
  ((byte *)Out)[3] = bVar2;
  Out = (tchar_t *)((byte *)Out + 4);
LAB_001255f3:
  *Out = 0;
  return 1;
}

Assistant:

bool_t BufferToBase64(tchar_t *Out, size_t OutLen, const uint8_t *Buffer, size_t BufferSize)
{
    while (BufferSize >= 3 && OutLen > 4) // treat packets of 3 bytes at once
    {
        Out[0] = Base64Char(Buffer[0] >> 2);
        Out[1] = Base64Char(((Buffer[0]&0x03)<<4) | (Buffer[1]>>4));
        Out[2] = Base64Char(((Buffer[1]&0x0F)<<2) | (Buffer[2]>>6));
        Out[3] = Base64Char(Buffer[2]&0x3F);
        BufferSize -= 3;
        Buffer += 3;
        OutLen -= 4;
        Out += 4;
    }

    if (BufferSize--)
    {
        if (OutLen < 5)
            return 0; // not enough room in the output buffer
        Out[0] = Base64Char(Buffer[0] >> 2);

        if (BufferSize--)
            Out[1] = Base64Char(((Buffer[0]&0x03)<<4) | (Buffer[1]>>4));
        else
            Out[1] = Base64Char((Buffer[0]&0x03)<<4);

        if (BufferSize == (size_t)-1)
            Out[2] = '=';
        else if (BufferSize--)
            Out[2] = Base64Char(((Buffer[1]&0x0F)<<2) | (Buffer[2]>>6));
        else
            Out[2] = Base64Char((Buffer[1]&0x0F)<<2);

        if (BufferSize == (size_t)-1)
            Out[3] = '=';
        else
            Out[3] = Base64Char(Buffer[2]&0x3F);
        Out += 4;
    }
    Out[0] = 0;
    return 1;
}